

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::segsegadjacent(tetgenmesh *this,face *seg1,face *seg2)

{
  int iVar1;
  int iVar2;
  point pb2;
  point pa2;
  point pb1;
  point pa1;
  int segidx2;
  int segidx1;
  face *seg2_local;
  face *seg1_local;
  tetgenmesh *this_local;
  
  iVar1 = getfacetindex(this,seg1);
  iVar2 = getfacetindex(this,seg2);
  if (iVar1 == iVar2) {
    this_local._4_4_ = 0;
  }
  else if ((((this->segmentendpointslist[iVar1 << 1] == this->segmentendpointslist[iVar2 << 1]) ||
            (this->segmentendpointslist[iVar1 << 1] == this->segmentendpointslist[iVar2 * 2 + 1]))
           || (this->segmentendpointslist[iVar1 * 2 + 1] == this->segmentendpointslist[iVar2 << 1]))
          || (this->segmentendpointslist[iVar1 * 2 + 1] == this->segmentendpointslist[iVar2 * 2 + 1]
             )) {
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int tetgenmesh::segsegadjacent(face *seg1, face *seg2)
{
  int segidx1 = getfacetindex(*seg1);
  int segidx2 = getfacetindex(*seg2);

  if (segidx1 == segidx2) return 0;

  point pa1 = segmentendpointslist[segidx1 * 2];
  point pb1 = segmentendpointslist[segidx1 * 2 + 1];
  point pa2 = segmentendpointslist[segidx2 * 2];
  point pb2 = segmentendpointslist[segidx2 * 2 + 1];

  if ((pa1 == pa2) || (pa1 == pb2) || (pb1 == pa2) || (pb1 == pb2)) {
    return 1;
  }
  return 0; 
}